

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_hook(lua_State *L,int event,int line,int ftransfer,int ntransfer)

{
  byte *pbVar1;
  lua_Hook p_Var2;
  StkId pSVar3;
  CallInfo *pCVar4;
  long lVar5;
  StkId pSVar6;
  StkId pSVar7;
  lua_Debug ar;
  lua_Debug local_c0;
  
  p_Var2 = L->hook;
  if ((p_Var2 != (lua_Hook)0x0) && (L->allowhook != '\0')) {
    pSVar3 = (L->top).p;
    pCVar4 = L->ci;
    lVar5 = (L->stack).offset;
    pSVar6 = (pCVar4->top).p;
    (L->transferinfo).ftransfer = ftransfer;
    (L->transferinfo).ntransfer = ntransfer;
    if (((pCVar4->callstatus & 0x8000) == 0) && (pSVar3 < (pCVar4->top).p)) {
      (L->top).p = (pCVar4->top).p;
    }
    local_c0.event = event;
    local_c0.currentline = line;
    local_c0.i_ci = pCVar4;
    if ((long)(L->stack_last).p - (L->top).offset < 0x150) {
      luaD_growstack(L,0x14,1);
    }
    pSVar7 = (StkId)((L->top).offset + 0x140);
    if ((pCVar4->top).p < pSVar7) {
      (pCVar4->top).p = pSVar7;
    }
    L->allowhook = '\0';
    pbVar1 = (byte *)((long)&pCVar4->callstatus + 2);
    *pbVar1 = *pbVar1 | 0x10;
    (*p_Var2)(L,&local_c0);
    L->allowhook = '\x01';
    (pCVar4->top).p = (StkId)(((long)pSVar6 - lVar5) + (long)(L->stack).p);
    (L->top).p = (StkId)(((long)pSVar3 - lVar5) + (long)(L->stack).p);
    pbVar1 = (byte *)((long)&pCVar4->callstatus + 2);
    *pbVar1 = *pbVar1 & 0xef;
  }
  return;
}

Assistant:

void luaD_hook (lua_State *L, int event, int line,
                              int ftransfer, int ntransfer) {
  lua_Hook hook = L->hook;
  if (hook && L->allowhook) {  /* make sure there is a hook */
    CallInfo *ci = L->ci;
    ptrdiff_t top = savestack(L, L->top.p);  /* preserve original 'top' */
    ptrdiff_t ci_top = savestack(L, ci->top.p);  /* idem for 'ci->top' */
    lua_Debug ar;
    ar.event = event;
    ar.currentline = line;
    ar.i_ci = ci;
    L->transferinfo.ftransfer = ftransfer;
    L->transferinfo.ntransfer = ntransfer;
    if (isLua(ci) && L->top.p < ci->top.p)
      L->top.p = ci->top.p;  /* protect entire activation register */
    luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
    if (ci->top.p < L->top.p + LUA_MINSTACK)
      ci->top.p = L->top.p + LUA_MINSTACK;
    L->allowhook = 0;  /* cannot call hooks inside a hook */
    ci->callstatus |= CIST_HOOKED;
    lua_unlock(L);
    (*hook)(L, &ar);
    lua_lock(L);
    lua_assert(!L->allowhook);
    L->allowhook = 1;
    ci->top.p = restorestack(L, ci_top);
    L->top.p = restorestack(L, top);
    ci->callstatus &= ~CIST_HOOKED;
  }
}